

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O1

void __thiscall wasm::TranslateToFuzzReader::addImportSleepSupport(TranslateToFuzzReader *this)

{
  Module *module;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  uint32_t uVar4;
  Function *__s;
  Name root;
  Signature SVar5;
  string_view sVar6;
  undefined8 local_48;
  undefined8 local_40;
  HeapType local_38;
  Type local_30;
  Function *local_28;
  __single_object func;
  
  if (this->preserveImportsAndExports == false) {
    uVar4 = Random::upTo(&this->random,4);
    if (uVar4 == 0) {
      module = this->wasm;
      root.super_IString.str = (IString)::wasm::IString::interned(5,"sleep",0);
      sVar6 = (string_view)Names::getValidFunctionName(module,root);
      (this->sleepImportName).super_IString.str = sVar6;
      __s = (Function *)operator_new(0x1d8);
      memset(__s,0,0x1d8);
      ::wasm::HeapType::HeapType(&__s->type,(Signature)ZEXT816(0));
      __s->profile = Normal;
      (__s->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__s->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__s->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      __s->body = (Expression *)0x0;
      (__s->localNames)._M_h._M_buckets = &(__s->localNames)._M_h._M_single_bucket;
      (__s->localNames)._M_h._M_bucket_count = 1;
      (__s->localNames)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      (__s->localNames)._M_h._M_element_count = 0;
      (__s->localNames)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      (__s->localNames)._M_h._M_rehash_policy._M_next_resize = 0;
      (__s->localNames)._M_h._M_single_bucket = (__node_base_ptr)0x0;
      (__s->localIndices)._M_h._M_buckets = &(__s->localIndices)._M_h._M_single_bucket;
      (__s->localIndices)._M_h._M_bucket_count = 1;
      (__s->localIndices)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      (__s->localIndices)._M_h._M_element_count = 0;
      (__s->localIndices)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      (__s->localIndices)._M_h._M_rehash_policy._M_next_resize = 0;
      (__s->localIndices)._M_h._M_single_bucket = (__node_base_ptr)0x0;
      (__s->debugLocations)._M_h._M_buckets = &(__s->debugLocations)._M_h._M_single_bucket;
      (__s->debugLocations)._M_h._M_bucket_count = 1;
      (__s->debugLocations)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      (__s->debugLocations)._M_h._M_element_count = 0;
      (__s->debugLocations)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      (__s->debugLocations)._M_h._M_rehash_policy._M_next_resize = 0;
      (__s->debugLocations)._M_h._M_single_bucket = (__node_base_ptr)0x0;
      (__s->prologLocation).super__Optional_base<wasm::Function::DebugLocation,_true,_true>.
      _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>._M_engaged = false;
      (__s->epilogLocation).super__Optional_base<wasm::Function::DebugLocation,_true,_true>.
      _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>._M_engaged = false;
      (__s->expressionLocations)._M_h._M_buckets = &(__s->expressionLocations)._M_h._M_single_bucket
      ;
      (__s->expressionLocations)._M_h._M_bucket_count = 1;
      (__s->expressionLocations)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      (__s->expressionLocations)._M_h._M_element_count = 0;
      (__s->expressionLocations)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      (__s->expressionLocations)._M_h._M_rehash_policy._M_next_resize = 0;
      (__s->expressionLocations)._M_h._M_single_bucket = (__node_base_ptr)0x0;
      (__s->delimiterLocations)._M_h._M_buckets = &(__s->delimiterLocations)._M_h._M_single_bucket;
      (__s->delimiterLocations)._M_h._M_bucket_count = 1;
      (__s->delimiterLocations)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      (__s->delimiterLocations)._M_h._M_element_count = 0;
      (__s->delimiterLocations)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      *(undefined8 *)((long)&(__s->delimiterLocations)._M_h._M_single_bucket + 4) = 0;
      (__s->funcLocation).declarations = 0;
      (__s->funcLocation).end = 0;
      (__s->delimiterLocations)._M_h._M_rehash_policy._M_next_resize = 0;
      (__s->delimiterLocations)._M_h._M_single_bucket = (__node_base_ptr)0x0;
      (__s->effects).super___shared_ptr<wasm::EffectAnalyzer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      (__s->effects).super___shared_ptr<wasm::EffectAnalyzer,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      __s->noFullInline = false;
      __s->noPartialInline = false;
      uVar1 = *(undefined4 *)((long)&(this->sleepImportName).super_IString.str._M_len + 4);
      uVar2 = *(undefined4 *)&(this->sleepImportName).super_IString.str._M_str;
      uVar3 = *(undefined4 *)((long)&(this->sleepImportName).super_IString.str._M_str + 4);
      *(int *)&(__s->super_Importable).super_Named.name.super_IString.str._M_len =
           (int)(this->sleepImportName).super_IString.str._M_len;
      *(undefined4 *)((long)&(__s->super_Importable).super_Named.name.super_IString.str._M_len + 4)
           = uVar1;
      *(undefined4 *)&(__s->super_Importable).super_Named.name.super_IString.str._M_str = uVar2;
      *(undefined4 *)((long)&(__s->super_Importable).super_Named.name.super_IString.str._M_str + 4)
           = uVar3;
      local_28 = __s;
      sVar6 = (string_view)::wasm::IString::interned(0xf,"fuzzing-support",0);
      (local_28->super_Importable).module.super_IString.str = sVar6;
      sVar6 = (string_view)::wasm::IString::interned(5,"sleep",0);
      (local_28->super_Importable).base.super_IString.str = sVar6;
      local_48 = 2;
      local_40 = 2;
      ::wasm::Type::Type(&local_30,&local_48,2);
      SVar5.results.id = 2;
      SVar5.params.id = local_30.id;
      ::wasm::HeapType::HeapType(&local_38,SVar5);
      (local_28->type).id = local_38.id;
      ::wasm::Module::addFunction((unique_ptr *)this->wasm);
      if (local_28 != (Function *)0x0) {
        std::default_delete<wasm::Function>::operator()
                  ((default_delete<wasm::Function> *)&local_28,local_28);
      }
    }
  }
  return;
}

Assistant:

void TranslateToFuzzReader::addImportSleepSupport() {
  // Fuzz this somewhat rarely, as it may be slow, and only when we can add
  // imports.
  if (preserveImportsAndExports || !oneIn(4)) {
    return;
  }

  // An import that sleeps for a given number of milliseconds, and also receives
  // an integer id. It returns that integer id (useful for tracking separate
  // sleeps).
  sleepImportName = Names::getValidFunctionName(wasm, "sleep");
  auto func = std::make_unique<Function>();
  func->name = sleepImportName;
  func->module = "fuzzing-support";
  func->base = "sleep";
  func->type = Signature({Type::i32, Type::i32}, Type::i32);
  wasm.addFunction(std::move(func));
}